

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

char * Scl_LibertyReadCellLeakage(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  Scl_Pair_t Pair;
  Scl_Item_t *pSVar7;
  Scl_Item_t *pSVar8;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if (-1 < (int)uVar1) {
      if (p->pItems != (Scl_Item_t *)0x0) {
        pSVar8 = p->pItems + uVar1;
        pcVar6 = p->pContents;
        do {
          iVar5 = (pSVar8->Key).Beg;
          iVar4 = (pSVar8->Key).End - iVar5;
          iVar5 = strncmp(pcVar6 + iVar5,"cell_leakage_power",(long)iVar4);
          if (iVar4 == 0x12 && iVar5 == 0) {
            Pair = pSVar8->Head;
LAB_0045f3c9:
            pcVar6 = Scl_LibertyReadString(p,Pair);
            return pcVar6;
          }
          uVar3 = pSVar8->Next;
          if (iVar2 <= (int)uVar3) goto LAB_0045f3df;
        } while ((-1 < (int)uVar3) && (pSVar8 = p->pItems + uVar3, p->pItems != (Scl_Item_t *)0x0));
        if ((int)uVar1 < 0) {
          return (char *)0x0;
        }
      }
      if (p->pItems != (Scl_Item_t *)0x0) {
        pSVar8 = p->pItems + uVar1;
        pcVar6 = p->pContents;
        do {
          iVar5 = (pSVar8->Key).Beg;
          iVar4 = (pSVar8->Key).End - iVar5;
          iVar5 = strncmp(pcVar6 + iVar5,"leakage_power",(long)iVar4);
          if (iVar4 == 0xd && iVar5 == 0) {
            uVar1 = pSVar8->Child;
            if (iVar2 <= (int)uVar1) goto LAB_0045f3df;
            if (-1 < (int)uVar1) {
              if (p->pItems != (Scl_Item_t *)0x0) {
                pSVar7 = p->pItems + uVar1;
                do {
                  iVar5 = (pSVar7->Key).Beg;
                  iVar4 = (pSVar7->Key).End - iVar5;
                  iVar5 = strncmp(pcVar6 + iVar5,"when",(long)iVar4);
                  if (iVar4 == 4 && iVar5 == 0) goto LAB_0045f38c;
                  uVar3 = pSVar7->Next;
                  if (iVar2 <= (int)uVar3) goto LAB_0045f3df;
                } while ((-1 < (int)uVar3) &&
                        (pSVar7 = p->pItems + uVar3, p->pItems != (Scl_Item_t *)0x0));
                if ((int)uVar1 < 0) goto LAB_0045f38c;
              }
              if (p->pItems != (Scl_Item_t *)0x0) {
                pSVar7 = p->pItems + uVar1;
                do {
                  iVar5 = (pSVar7->Key).Beg;
                  iVar4 = (pSVar7->Key).End - iVar5;
                  iVar5 = strncmp(pcVar6 + iVar5,"value",(long)iVar4);
                  if (iVar4 == 5 && iVar5 == 0) {
                    Pair = pSVar7->Head;
                    goto LAB_0045f3c9;
                  }
                  uVar1 = pSVar7->Next;
                  if (iVar2 <= (int)uVar1) goto LAB_0045f3df;
                } while ((-1 < (int)uVar1) &&
                        (pSVar7 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
              }
            }
          }
LAB_0045f38c:
          uVar1 = pSVar8->Next;
          if (iVar2 <= (int)uVar1) goto LAB_0045f3df;
        } while ((-1 < (int)uVar1) && (pSVar8 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
      }
    }
    return (char *)0x0;
  }
LAB_0045f3df:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

char * Scl_LibertyReadCellLeakage( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pItem, * pChild;
    Scl_ItemForEachChildName( p, pCell, pItem, "cell_leakage_power" )
        return Scl_LibertyReadString(p, pItem->Head);
    // look for another type
    Scl_ItemForEachChildName( p, pCell, pItem, "leakage_power" )
    {
        Scl_ItemForEachChildName( p, pItem, pChild, "when" )
            break;
        if ( pChild && !Scl_LibertyCompare(p, pChild->Key, "when") )
            continue;
        Scl_ItemForEachChildName( p, pItem, pChild, "value" )
            return Scl_LibertyReadString(p, pChild->Head);
    }
    return 0;
}